

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  exception *in_RDI;
  memory_buf_t outbuf;
  allocator<char> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  string local_170 [80];
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  buffer<char> *in_stack_ffffffffffffff10;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__spdlog_ex_00493d88;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      in_stack_fffffffffffffe68);
  std::__cxx11::string::c_str();
  ::fmt::v11::format_system_error
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
  ::fmt::v11::to_string<250ul>(in_stack_fffffffffffffee0);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_170);
  std::__cxx11::string::~string(local_170);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x333344);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}